

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_iter.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_d5c8::
ARTIteratorTest_singleLeafIteratorOneValue_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::~ARTIteratorTest_singleLeafIteratorOneValue_Test
          (ARTIteratorTest_singleLeafIteratorOneValue_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  ARTIteratorTest_singleLeafIteratorOneValue_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  
  ~ARTIteratorTest_singleLeafIteratorOneValue_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTIteratorTest, singleLeafIteratorOneValue) {
  unodb::test::tree_verifier<TypeParam> verifier;
  TypeParam& db = verifier.get_db();  // reference to test db instance.
  verifier.insert(0, unodb::test::test_values[0]);
  auto b = db.test_only_iterator();
  b.first();  // obtain iterator.
  UNODB_EXPECT_TRUE(b.valid());
  UNODB_EXPECT_EQ(decode(b.get_key()), 0);
  UNODB_EXPECT_TRUE(
      std::ranges::equal(b.get_val(), unodb::test::test_values[0]));
  b.next();                       // advance.
  UNODB_EXPECT_FALSE(b.valid());  // nothing more in the iterator.
}